

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.h
# Opt level: O0

void __thiscall
dg::GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::buildGlobals
          (GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph> *this)

{
  bool bVar1;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_true>
  this_00;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_true>
  val;
  const_iterator __position;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_true>
  *this_01;
  long in_RDI;
  NodesSeq<dg::dda::RWNode> cur;
  GlobalVariable *G;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_true>
  __end2;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_true>
  __begin2;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_true>_>
  *__range2;
  NodesSeq<dg::dda::RWNode> *in_stack_ffffffffffffff68;
  Module *in_stack_ffffffffffffff80;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *in_stack_ffffffffffffffb0;
  __normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
  in_stack_ffffffffffffffb8;
  __normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
  in_stack_ffffffffffffffc0;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_true>_>
  local_20;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_true>_>
  *local_10;
  
  local_20 = llvm::Module::globals(in_stack_ffffffffffffff80);
  local_10 = &local_20;
  this_00 = llvm::
            iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_true>_>
            ::begin(local_10);
  val = llvm::
        iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_true>_>
        ::end(local_10);
  while( true ) {
    bVar1 = llvm::operator!=((ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_true>
                              *)&stack0xffffffffffffffd8,
                             (ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_true>
                              *)&stack0xffffffffffffffd0);
    if (!bVar1) break;
    __position._M_current =
         (RWNode **)
         llvm::
         ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_true>
         ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_true>
                      *)0x1a9455);
    buildNode((GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph> *)
              this_00.NodePtr,(Value *)val.NodePtr);
    this_01 = (ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_true>
               *)(in_RDI + 0xb8);
    std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::end
              (&in_stack_ffffffffffffff68->nodes);
    __gnu_cxx::
    __normal_iterator<dg::dda::RWNode*const*,std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>
    ::__normal_iterator<dg::dda::RWNode**>
              ((__normal_iterator<dg::dda::RWNode_*const_*,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                *)this_01,
               (__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                *)in_stack_ffffffffffffff68);
    NodesSeq<dg::dda::RWNode>::begin(in_stack_ffffffffffffff68);
    NodesSeq<dg::dda::RWNode>::end(in_stack_ffffffffffffff68);
    std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
    insert<__gnu_cxx::__normal_iterator<dg::dda::RWNode**,std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>,void>
              (in_stack_ffffffffffffffb0,__position,in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffb8);
    NodesSeq<dg::dda::RWNode>::~NodesSeq((NodesSeq<dg::dda::RWNode> *)0x1a94e7);
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_true>
    ::operator++(this_01);
  }
  return;
}

Assistant:

void buildGlobals() {
        DBG_SECTION_BEGIN(dg, "Building globals");

        for (const auto &G : _module->globals()) {
            // every global node is like memory allocation
            auto cur = buildNode(&G);
            _globals.insert(_globals.end(), cur.begin(), cur.end());
        }

        DBG_SECTION_END(dg, "Building globals done");
    }